

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::encryption_handler::encrypt(encryption_handler *this,char *__block,int __edflag)

{
  undefined8 uVar1;
  undefined8 uVar2;
  _List_node_base *p_Var3;
  code *pcVar4;
  iterator __position;
  _List_node_base **__s;
  ulong uVar5;
  ulong uVar6;
  ulong in_RCX;
  ulong uVar7;
  undefined4 in_register_00000014;
  _List_node_base **pp_Var8;
  long lVar9;
  uint uVar10;
  _List_node_base **pp_Var11;
  _List_node_base **pp_Var12;
  int iVar13;
  undefined4 uVar14;
  span<char> *current;
  _List_node_base *local_58 [2];
  undefined4 local_48;
  encryption_handler *local_40;
  list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
  *local_38;
  
  pp_Var8 = (_List_node_base **)CONCAT44(in_register_00000014,__edflag);
  pp_Var12 = local_58;
  pp_Var11 = local_58;
  uVar10 = *(uint *)(*(long *)__block + 0x20);
  local_40 = this;
  local_38 = (list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
              *)__block;
  if (uVar10 == 0x7fffffff) {
    uVar10 = 0x7fffffff;
    __s = pp_Var8;
    uVar6 = in_RCX;
    goto LAB_003aec17;
  }
  if ((long)in_RCX < 0x101) {
    if (0 < (long)in_RCX) {
      pp_Var11 = local_58 + in_RCX * -2;
      __s = pp_Var11;
      goto LAB_003aeb8f;
    }
    __s = (_List_node_base **)0x0;
    pp_Var12 = local_58;
  }
  else {
    __s = (_List_node_base **)operator_new__(-(ulong)(in_RCX >> 0x3c != 0) | in_RCX << 4);
LAB_003aeb8f:
    pp_Var11[-1] = (_List_node_base *)0x3aeb94;
    memset(__s,0,in_RCX << 4);
    pp_Var12 = pp_Var11;
  }
  if ((int)uVar10 < 1) {
    uVar6 = 0;
  }
  else {
    uVar5 = 0;
    uVar7 = 0;
    if (0 < (long)in_RCX) {
      uVar7 = in_RCX;
    }
    lVar9 = 8;
    do {
      uVar6 = uVar7;
      if (uVar7 == uVar5) break;
      uVar1 = *(undefined8 *)((long)pp_Var8 + lVar9 + -8);
      uVar2 = *(undefined8 *)((long)pp_Var8 + lVar9);
      iVar13 = (int)uVar2;
      if ((int)uVar10 < iVar13) {
        *(undefined8 *)((long)__s + lVar9 + -8) = uVar1;
        *(ulong *)((long)__s + lVar9) = (ulong)uVar10;
        uVar10 = 0;
      }
      else {
        *(undefined8 *)((long)__s + lVar9 + -8) = uVar1;
        *(undefined8 *)((long)__s + lVar9) = uVar2;
        uVar10 = uVar10 - iVar13;
      }
      lVar9 = lVar9 + 0x10;
      uVar5 = uVar5 + 1;
      uVar6 = uVar5;
    } while (0 < (int)uVar10);
    uVar6 = uVar6 & 0xffffffff;
  }
  __block = (char *)local_38;
  if (__s != (_List_node_base **)0x0 && 0x100 < (long)in_RCX) {
    *(undefined8 *)((long)pp_Var12 + -8) = 0x3aec17;
    operator_delete__(__s);
  }
LAB_003aec17:
  if (uVar6 == 0) {
    local_58[0] = (_List_node_base *)0x0;
    local_58[1] = (_List_node_base *)0x0;
    local_48 = 0;
  }
  else {
    p_Var3 = (((list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
                *)__block)->
             super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
             )._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
    pcVar4 = *(code **)((long)p_Var3->_M_next + 0x20);
    *(undefined8 *)((long)pp_Var12 + -8) = 0x3aec37;
    (*pcVar4)(local_58,p_Var3,__s,uVar6);
  }
  __position._M_node =
       (((list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
          *)__block)->
       super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
       )._M_impl._M_node.super__List_node_base._M_next;
  uVar14 = local_48;
  if (*(int *)&__position._M_node[2]._M_next != 0x7fffffff) {
    if (uVar10 == 0) {
      if ((((list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
             *)__block)->
          super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
          )._M_impl._M_node._M_size == 1) {
        uVar14 = 0x7fffffff;
      }
      *(undefined8 *)((long)pp_Var12 + -8) = 0x3aec79;
      ::std::__cxx11::
      list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
      ::_M_erase((list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
                  *)__block,__position);
    }
    else {
      *(uint *)&__position._M_node[2]._M_next = uVar10;
    }
  }
  (local_40->m_send_barriers).
  super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
  ._M_impl._M_node.super__List_node_base._M_next = local_58[0];
  (local_40->m_send_barriers).
  super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
  ._M_impl._M_node.super__List_node_base._M_prev = local_58[1];
  *(undefined4 *)
   &(local_40->m_send_barriers).
    super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
    ._M_impl._M_node._M_size = uVar14;
  return;
}

Assistant:

std::tuple<int, span<span<char const>>>
	encryption_handler::encrypt(
		span<span<char>> iovec)
	{
		TORRENT_ASSERT(!m_send_barriers.empty());
		TORRENT_ASSERT(m_send_barriers.front().enc_handler);

		int to_process = m_send_barriers.front().next;

		span<span<char>> bufs;
		bool need_destruct = false;
		if (to_process != INT_MAX)
		{
			TORRENT_ALLOCA(abufs, span<char>, iovec.size());
			bufs = abufs;
			need_destruct = true;
			int num_bufs = 0;
			for (int i = 0; to_process > 0 && i < iovec.size(); ++i)
			{
				++num_bufs;
				int const size = int(iovec[i].size());
				if (to_process < size)
				{
					new (&bufs[i]) span<char>(
						iovec[i].data(), to_process);
					to_process = 0;
				}
				else
				{
					new (&bufs[i]) span<char>(iovec[i]);
					to_process -= size;
				}
			}
			bufs = bufs.first(num_bufs);
		}
		else
		{
			bufs = iovec;
		}

		int next_barrier = 0;
		span<span<char const>> out_iovec;
		if (!bufs.empty())
		{
			std::tie(next_barrier, out_iovec)
				= m_send_barriers.front().enc_handler->encrypt(bufs);
		}

		if (m_send_barriers.front().next != INT_MAX)
		{
			// to_process holds the difference between the size of the buffers
			// and the bytes left to the next barrier
			// if it's zero then pop the barrier
			// otherwise update the number of bytes remaining to the next barrier
			if (to_process == 0)
			{
				if (m_send_barriers.size() == 1)
				{
					// transitioning back to plaintext
					next_barrier = INT_MAX;
				}
				m_send_barriers.pop_front();
			}
			else
			{
				m_send_barriers.front().next = to_process;
			}
		}

#if TORRENT_USE_ASSERTS
		if (next_barrier != INT_MAX && next_barrier != 0)
		{
			int payload = 0;
			for (auto buf : bufs)
				payload += int(buf.size());

			int overhead = 0;
			for (auto buf : out_iovec)
				overhead += int(buf.size());
			TORRENT_ASSERT(overhead + payload == next_barrier);
		}
#endif
		if (need_destruct)
		{
			for (auto buf : bufs)
				buf.~span<char>();
		}
		return std::make_tuple(next_barrier, out_iovec);
	}